

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

int __thiscall btSoftBody::generateClusters(btSoftBody *this,int k,int maxiterations)

{
  Node **ppNVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  Node *pNVar5;
  Cluster **ppCVar6;
  Face *pFVar7;
  bool *pbVar8;
  Cluster *pCVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  uint uVar13;
  Cluster *pCVar14;
  byte bVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  Cluster *cla;
  int j_1;
  int iVar21;
  int j;
  long lVar22;
  btVector3 *pbVar23;
  int *piVar24;
  long lVar25;
  int i_1;
  ulong uVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  btScalar bVar30;
  btScalar bVar31;
  float fVar32;
  float fVar33;
  btVector3 bVar34;
  int idx [3];
  btScalar bStack_dc;
  Node *local_d0;
  undefined1 local_c8 [16];
  btAlignedObjectArray<int> cids;
  btVector3 local_98;
  btAlignedObjectArray<btSoftBody::Cluster_*> *local_80;
  ulong local_78;
  int local_6c;
  btAlignedObjectArray<btVector3> centers;
  
  local_6c = maxiterations;
  releaseClusters(this);
  local_80 = &this->m_clusters;
  iVar18 = (this->m_nodes).m_size;
  if (iVar18 < k) {
    k = iVar18;
  }
  centers._0_4_ = 0;
  centers.m_size = 0;
  btAlignedObjectArray<btSoftBody::Cluster_*>::resize(local_80,k,(Cluster **)&centers);
  lVar17 = 0;
  while( true ) {
    iVar18 = (this->m_clusters).m_size;
    uVar26 = (ulong)iVar18;
    if ((long)uVar26 <= lVar17) break;
    pCVar14 = (Cluster *)btAlignedAllocInternal(0x1a8,0x10);
    Cluster::Cluster(pCVar14);
    (this->m_clusters).m_data[lVar17] = pCVar14;
    (this->m_clusters).m_data[lVar17]->m_collide = true;
    lVar17 = lVar17 + 1;
  }
  if (iVar18 < 1) {
    iVar18 = (this->m_tetras).m_size;
    if (iVar18 == 0) {
      centers._0_4_ = 0;
      centers.m_size = 0;
      btAlignedObjectArray<btSoftBody::Cluster_*>::resize
                (local_80,(this->m_faces).m_size,(Cluster **)&centers);
      for (lVar17 = 0; lVar17 < (this->m_clusters).m_size; lVar17 = lVar17 + 1) {
        pCVar14 = (Cluster *)btAlignedAllocInternal(0x1a8,0x10);
        Cluster::Cluster(pCVar14);
        (this->m_clusters).m_data[lVar17] = pCVar14;
        (this->m_clusters).m_data[lVar17]->m_collide = true;
      }
      lVar17 = 0x10;
      for (lVar22 = 0; lVar22 < (this->m_faces).m_size; lVar22 = lVar22 + 1) {
        for (lVar25 = 0; lVar25 != 0x18; lVar25 = lVar25 + 8) {
          btAlignedObjectArray<btSoftBody::Node_*>::push_back
                    (&(this->m_clusters).m_data[lVar22]->m_nodes,
                     (Node **)((long)((this->m_faces).m_data)->m_n + lVar25 + lVar17 + -0x10));
        }
        lVar17 = lVar17 + 0x48;
      }
    }
    else {
      lVar17 = 0x10;
      centers._0_4_ = 0;
      centers.m_size = 0;
      btAlignedObjectArray<btSoftBody::Cluster_*>::resize(local_80,iVar18,(Cluster **)&centers);
      for (lVar22 = 0; lVar22 < (this->m_clusters).m_size; lVar22 = lVar22 + 1) {
        pCVar14 = (Cluster *)btAlignedAllocInternal(0x1a8,0x10);
        Cluster::Cluster(pCVar14);
        (this->m_clusters).m_data[lVar22] = pCVar14;
        (this->m_clusters).m_data[lVar22]->m_collide = true;
      }
      for (lVar22 = 0; lVar22 < (this->m_tetras).m_size; lVar22 = lVar22 + 1) {
        for (lVar25 = 0; lVar25 != 0x20; lVar25 = lVar25 + 8) {
          btAlignedObjectArray<btSoftBody::Node_*>::push_back
                    (&(this->m_clusters).m_data[lVar22]->m_nodes,
                     (Node **)((long)((this->m_tetras).m_data)->m_n + lVar25 + lVar17 + -0x10));
        }
        lVar17 = lVar17 + 0x88;
      }
    }
  }
  else {
    centers.m_ownsMemory = true;
    centers.m_data = (btVector3 *)0x0;
    centers.m_size = 0;
    centers.m_capacity = 0;
    local_98.m_floats[0] = 0.0;
    local_98.m_floats[1] = 0.0;
    local_98.m_floats[2] = 0.0;
    local_98.m_floats[3] = 0.0;
    lVar17 = 0;
    iVar21 = 0;
    for (lVar22 = 0; iVar3 = (this->m_nodes).m_size, lVar22 < iVar3; lVar22 = lVar22 + 1) {
      pNVar5 = (this->m_nodes).m_data;
      local_98.m_floats[1] =
           *(float *)((long)(pNVar5->m_x).m_floats + lVar17 + 4) + local_98.m_floats[1];
      local_98.m_floats[0] =
           *(float *)((long)(pNVar5->m_x).m_floats + lVar17) + local_98.m_floats[0];
      local_98.m_floats[2] =
           *(float *)((long)(pNVar5->m_x).m_floats + lVar17 + 8) + local_98.m_floats[2];
      cids._0_8_ = (long)&(((Node *)(&pNVar5->m_x + -1))->super_Feature).super_Element.m_tag +
                   lVar17;
      btAlignedObjectArray<btSoftBody::Node_*>::push_back
                (&(this->m_clusters).m_data
                  [(long)iVar21 % (long)(this->m_clusters).m_size & 0xffffffff]->m_nodes,
                 (Node **)&cids);
      iVar21 = iVar21 + 0x74b1;
      lVar17 = lVar17 + 0x78;
    }
    cids._0_4_ = (float)iVar3;
    btVector3::operator/=(&local_98,(btScalar *)&cids);
    btAlignedObjectArray<btVector3>::resize(&centers,iVar18,&local_98);
    local_78 = 0;
    do {
      fVar28 = (float)(int)local_78 * 0.0625;
      fVar29 = 1.0;
      if (fVar28 <= 1.0) {
        fVar29 = fVar28;
      }
      fVar29 = 2.0 - fVar29;
      local_78 = (ulong)((int)local_78 + 1);
      local_c8 = ZEXT416((uint)fVar29);
      bVar15 = 0;
      for (uVar19 = 0; uVar19 != uVar26; uVar19 = uVar19 + 1) {
        fVar28 = 0.0;
        fVar32 = 0.0;
        cids._0_16_ = ZEXT816(0);
        pCVar14 = (this->m_clusters).m_data[uVar19];
        uVar13 = (pCVar14->m_nodes).m_size;
        uVar16 = 0;
        if (0 < (int)uVar13) {
          uVar16 = (ulong)uVar13;
        }
        fVar33 = 0.0;
        for (uVar20 = 0; auVar10 = (undefined1  [16])cids._0_16_, uVar16 != uVar20;
            uVar20 = uVar20 + 1) {
          pNVar5 = (pCVar14->m_nodes).m_data[uVar20];
          uVar2 = *(undefined8 *)(pNVar5->m_x).m_floats;
          fVar28 = fVar28 + (float)uVar2;
          fVar32 = fVar32 + (float)((ulong)uVar2 >> 0x20);
          cids.m_size = (int)fVar32;
          cids._0_4_ = fVar28;
          fVar33 = fVar33 + (pNVar5->m_x).m_floats[2];
          cids._12_4_ = auVar10._12_4_;
          cids.m_capacity = (int)fVar33;
        }
        if (uVar13 != 0) {
          idx[0] = (int)(float)(int)uVar13;
          btVector3::operator/=((btVector3 *)&cids,(btScalar *)idx);
          pbVar23 = centers.m_data + uVar19;
          bVar34 = operator-((btVector3 *)&cids,pbVar23);
          idx[1] = (int)(bVar34.m_floats[1] * fVar29);
          idx[0] = (int)(bVar34.m_floats[0] * fVar29);
          idx[2] = (int)(bVar34.m_floats[2] * (float)local_c8._0_4_);
          bStack_dc = 0.0;
          cids._0_16_ = operator+(pbVar23,(btVector3 *)idx);
          _idx = operator-((btVector3 *)&cids,centers.m_data + uVar19);
          bVar30 = btVector3::length2((btVector3 *)idx);
          auVar11 = (undefined1  [16])cids._0_16_;
          pbVar23 = centers.m_data + uVar19;
          pbVar23->m_floats[0] = (btScalar)cids._0_4_;
          pbVar23->m_floats[1] = (btScalar)cids.m_size;
          pbVar23->m_floats[2] = (btScalar)cids.m_capacity;
          pbVar23->m_floats[3] = (btScalar)cids._12_4_;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = stack0xffffffffffffff20;
          _idx = (btScalar  [4])(auVar10 << 0x40);
          cids._0_16_ = auVar11;
          btAlignedObjectArray<btSoftBody::Node_*>::resize
                    (&(this->m_clusters).m_data[uVar19]->m_nodes,0,(Node **)idx);
          bVar15 = bVar15 | 1.1920929e-07 < bVar30;
        }
      }
      lVar17 = 0;
      while (iVar18 = (this->m_nodes).m_size, lVar17 < iVar18) {
        cids._0_16_ = *(undefined1 (*) [16])(this->m_nodes).m_data[lVar17].m_x.m_floats;
        bVar30 = ClusterMetric(centers.m_data,(btVector3 *)&cids);
        local_c8._0_8_ = lVar17;
        uVar16 = 0;
        lVar22 = 0x10;
        for (uVar19 = 1; uVar26 != uVar19; uVar19 = uVar19 + 1) {
          bVar31 = ClusterMetric((btVector3 *)((long)(centers.m_data)->m_floats + lVar22),
                                 (btVector3 *)&cids);
          if (bVar31 < bVar30) {
            uVar16 = uVar19 & 0xffffffff;
            bVar30 = bVar31;
          }
          lVar22 = lVar22 + 0x10;
        }
        idx._0_8_ = (this->m_nodes).m_data + lVar17;
        btAlignedObjectArray<btSoftBody::Node_*>::push_back
                  (&(this->m_clusters).m_data[(int)uVar16]->m_nodes,(Node **)idx);
        lVar17 = local_c8._0_8_ + 1;
      }
    } while ((bool)(bVar15 & (int)local_78 < local_6c));
    cids.m_ownsMemory = true;
    cids.m_data = (int *)0x0;
    cids.m_size = 0;
    cids.m_capacity = 0;
    idx[0] = -1;
    btAlignedObjectArray<int>::resize(&cids,iVar18,idx);
    ppCVar6 = (this->m_clusters).m_data;
    for (lVar17 = 0; lVar17 < (this->m_clusters).m_size; lVar17 = lVar17 + 1) {
      pCVar14 = ppCVar6[lVar17];
      pNVar5 = (this->m_nodes).m_data;
      for (lVar22 = 0; lVar22 < (pCVar14->m_nodes).m_size; lVar22 = lVar22 + 1) {
        cids.m_data[(int)(((long)(pCVar14->m_nodes).m_data[lVar22] - (long)pNVar5) / 0x78)] =
             (int)lVar17;
      }
    }
    uVar26 = 0;
    while (bVar34.m_floats = _idx, (long)uVar26 < (long)(this->m_faces).m_size) {
      pNVar5 = (this->m_nodes).m_data;
      pFVar7 = (this->m_faces).m_data;
      local_78 = uVar26;
      idx[1] = (int)(((long)pFVar7[uVar26].m_n[1] - (long)pNVar5) / 0x78);
      idx[0] = (int)(((long)pFVar7[uVar26].m_n[0] - (long)pNVar5) / 0x78);
      bStack_dc = bVar34.m_floats[3];
      idx[2] = (int)(((long)pFVar7[uVar26].m_n[2] - (long)pNVar5) / 0x78);
      uVar26 = 1;
      piVar24 = idx;
      for (lVar17 = 0; piVar24 = piVar24 + 1, lVar17 != 3; lVar17 = lVar17 + 1) {
        iVar18 = cids.m_data[idx[lVar17]];
        local_c8._0_8_ = piVar24;
        iVar21 = 2;
        uVar19 = uVar26;
        while( true ) {
          bVar27 = iVar21 == 0;
          iVar21 = iVar21 + -1;
          if (bVar27) break;
          iVar3 = piVar24[(uVar19 / 3) * -3];
          if (cids.m_data[iVar3] != iVar18) {
            local_d0 = (this->m_nodes).m_data + iVar3;
            iVar12 = btAlignedObjectArray<btSoftBody::Node_*>::findLinearSearch
                               (&(this->m_clusters).m_data[iVar18]->m_nodes,&local_d0);
            ppCVar6 = (this->m_clusters).m_data;
            if (iVar12 == (ppCVar6[iVar18]->m_nodes).m_size) {
              local_d0 = (this->m_nodes).m_data + iVar3;
              btAlignedObjectArray<btSoftBody::Node_*>::push_back
                        (&ppCVar6[iVar18]->m_nodes,&local_d0);
            }
          }
          piVar24 = piVar24 + 1;
          uVar19 = uVar19 + 1;
        }
        uVar26 = uVar26 + 1;
        piVar24 = (int *)local_c8._0_8_;
      }
      uVar26 = local_78 + 1;
    }
    uVar13 = (this->m_clusters).m_size;
    uVar26 = (ulong)uVar13;
    if (1 < (int)uVar13) {
      pCVar14 = (Cluster *)btAlignedAllocInternal(0x1a8,0x10);
      Cluster::Cluster(pCVar14);
      idx._0_8_ = pCVar14;
      pCVar14->m_collide = false;
      btAlignedObjectArray<btSoftBody::Node_*>::reserve(&pCVar14->m_nodes,(this->m_nodes).m_size);
      lVar17 = 0;
      for (lVar22 = 0; lVar22 < (this->m_nodes).m_size; lVar22 = lVar22 + 1) {
        local_d0 = (Node *)((long)&(((Node *)(&((this->m_nodes).m_data)->m_x + -1))->super_Feature).
                                   super_Element.m_tag + lVar17);
        btAlignedObjectArray<btSoftBody::Node_*>::push_back(&pCVar14->m_nodes,&local_d0);
        lVar17 = lVar17 + 0x78;
      }
      btAlignedObjectArray<btSoftBody::Cluster_*>::push_back(local_80,(Cluster **)idx);
      ppCVar6 = (this->m_clusters).m_data;
      uVar26 = (ulong)(this->m_clusters).m_size;
      pCVar14 = *ppCVar6;
      *ppCVar6 = ppCVar6[uVar26 - 1];
      ppCVar6[uVar26 - 1] = pCVar14;
    }
    for (iVar18 = 0; iVar18 < (int)uVar26; iVar18 = iVar18 + 1) {
      if (((this->m_clusters).m_data[iVar18]->m_nodes).m_size == 0) {
        releaseCluster(this,iVar18);
        iVar18 = iVar18 + -1;
        uVar26 = (ulong)(uint)(this->m_clusters).m_size;
      }
    }
    btAlignedObjectArray<int>::~btAlignedObjectArray(&cids);
    btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&centers);
  }
  if ((this->m_clusters).m_size == 0) {
    uVar13 = 0;
  }
  else {
    initializeClusters(this);
    updateClusters(this);
    iVar18 = (this->m_clusters).m_size;
    centers._0_4_ = centers._0_4_ & 0xffffff00;
    btAlignedObjectArray<bool>::resize
              (&this->m_clusterConnectivity,iVar18 * iVar18,(bool *)&centers);
    uVar13 = (this->m_clusters).m_size;
    ppCVar6 = (this->m_clusters).m_data;
    uVar26 = 0;
    if (0 < (int)uVar13) {
      uVar26 = (ulong)uVar13;
    }
    for (uVar19 = 0; uVar19 != uVar26; uVar19 = uVar19 + 1) {
      pCVar14 = ppCVar6[uVar19];
      pCVar14->m_clusterIndex = (int)uVar19;
      pbVar8 = (this->m_clusterConnectivity).m_data;
      for (uVar16 = 0; uVar16 != uVar13; uVar16 = uVar16 + 1) {
        pCVar9 = ppCVar6[uVar16];
        bVar27 = false;
        for (lVar17 = 0; (!bVar27 && (lVar17 < (pCVar14->m_nodes).m_size)); lVar17 = lVar17 + 1) {
          uVar4 = (pCVar9->m_nodes).m_size;
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          uVar20 = 0;
          do {
            if (uVar4 == uVar20) goto LAB_0019e53a;
            ppNVar1 = (pCVar9->m_nodes).m_data + uVar20;
            uVar20 = uVar20 + 1;
          } while ((pCVar14->m_nodes).m_data[lVar17] != *ppNVar1);
          bVar27 = true;
LAB_0019e53a:
        }
        pbVar8[uVar16 * (long)(int)uVar13 + uVar19] = bVar27;
      }
    }
  }
  return uVar13;
}

Assistant:

int				btSoftBody::generateClusters(int k,int maxiterations)
{
	int i;
	releaseClusters();
	m_clusters.resize(btMin(k,m_nodes.size()));
	for(i=0;i<m_clusters.size();++i)
	{
		m_clusters[i]			=	new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
		m_clusters[i]->m_collide=	true;
	}
	k=m_clusters.size();
	if(k>0)
	{
		/* Initialize		*/ 
		btAlignedObjectArray<btVector3>	centers;
		btVector3						cog(0,0,0);
		int								i;
		for(i=0;i<m_nodes.size();++i)
		{
			cog+=m_nodes[i].m_x;
			m_clusters[(i*29873)%m_clusters.size()]->m_nodes.push_back(&m_nodes[i]);
		}
		cog/=(btScalar)m_nodes.size();
		centers.resize(k,cog);
		/* Iterate			*/ 
		const btScalar	slope=16;
		bool			changed;
		int				iterations=0;
		do	{
			const btScalar	w=2-btMin<btScalar>(1,iterations/slope);
			changed=false;
			iterations++;	
			int i;

			for(i=0;i<k;++i)
			{
				btVector3	c(0,0,0);
				for(int j=0;j<m_clusters[i]->m_nodes.size();++j)
				{
					c+=m_clusters[i]->m_nodes[j]->m_x;
				}
				if(m_clusters[i]->m_nodes.size())
				{
					c			/=	(btScalar)m_clusters[i]->m_nodes.size();
					c			=	centers[i]+(c-centers[i])*w;
					changed		|=	((c-centers[i]).length2()>SIMD_EPSILON);
					centers[i]	=	c;
					m_clusters[i]->m_nodes.resize(0);
				}			
			}
			for(i=0;i<m_nodes.size();++i)
			{
				const btVector3	nx=m_nodes[i].m_x;
				int				kbest=0;
				btScalar		kdist=ClusterMetric(centers[0],nx);
				for(int j=1;j<k;++j)
				{
					const btScalar	d=ClusterMetric(centers[j],nx);
					if(d<kdist)
					{
						kbest=j;
						kdist=d;
					}
				}
				m_clusters[kbest]->m_nodes.push_back(&m_nodes[i]);
			}		
		} while(changed&&(iterations<maxiterations));
		/* Merge		*/ 
		btAlignedObjectArray<int>	cids;
		cids.resize(m_nodes.size(),-1);
		for(i=0;i<m_clusters.size();++i)
		{
			for(int j=0;j<m_clusters[i]->m_nodes.size();++j)
			{
				cids[int(m_clusters[i]->m_nodes[j]-&m_nodes[0])]=i;
			}
		}
		for(i=0;i<m_faces.size();++i)
		{
			const int idx[]={	int(m_faces[i].m_n[0]-&m_nodes[0]),
				int(m_faces[i].m_n[1]-&m_nodes[0]),
				int(m_faces[i].m_n[2]-&m_nodes[0])};
			for(int j=0;j<3;++j)
			{
				const int cid=cids[idx[j]];
				for(int q=1;q<3;++q)
				{
					const int kid=idx[(j+q)%3];
					if(cids[kid]!=cid)
					{
						if(m_clusters[cid]->m_nodes.findLinearSearch(&m_nodes[kid])==m_clusters[cid]->m_nodes.size())
						{
							m_clusters[cid]->m_nodes.push_back(&m_nodes[kid]);
						}
					}
				}
			}
		}
		/* Master		*/ 
		if(m_clusters.size()>1)
		{
			Cluster*	pmaster=new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
			pmaster->m_collide	=	false;
			pmaster->m_nodes.reserve(m_nodes.size());
			for(int i=0;i<m_nodes.size();++i) pmaster->m_nodes.push_back(&m_nodes[i]);
			m_clusters.push_back(pmaster);
			btSwap(m_clusters[0],m_clusters[m_clusters.size()-1]);
		}
		/* Terminate	*/ 
		for(i=0;i<m_clusters.size();++i)
		{
			if(m_clusters[i]->m_nodes.size()==0)
			{
				releaseCluster(i--);
			}
		}
	} else
	{
		//create a cluster for each tetrahedron (if tetrahedra exist) or each face
		if (m_tetras.size())
		{
			m_clusters.resize(m_tetras.size());
			for(i=0;i<m_clusters.size();++i)
			{
				m_clusters[i]			=	new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
				m_clusters[i]->m_collide=	true;
			}
			for (i=0;i<m_tetras.size();i++)
			{
				for (int j=0;j<4;j++)
				{
					m_clusters[i]->m_nodes.push_back(m_tetras[i].m_n[j]);
				}
			}

		} else
		{
			m_clusters.resize(m_faces.size());
			for(i=0;i<m_clusters.size();++i)
			{
				m_clusters[i]			=	new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
				m_clusters[i]->m_collide=	true;
			}

			for(i=0;i<m_faces.size();++i)
			{
				for(int j=0;j<3;++j)
				{
					m_clusters[i]->m_nodes.push_back(m_faces[i].m_n[j]);
				}
			}
		}
	}

	if (m_clusters.size())
	{
		initializeClusters();
		updateClusters();


		//for self-collision
		m_clusterConnectivity.resize(m_clusters.size()*m_clusters.size());
		{
			for (int c0=0;c0<m_clusters.size();c0++)
			{
				m_clusters[c0]->m_clusterIndex=c0;
				for (int c1=0;c1<m_clusters.size();c1++)
				{
					
					bool connected=false;
					Cluster* cla = m_clusters[c0];
					Cluster* clb = m_clusters[c1];
					for (int i=0;!connected&&i<cla->m_nodes.size();i++)
					{
						for (int j=0;j<clb->m_nodes.size();j++)
						{
							if (cla->m_nodes[i] == clb->m_nodes[j])
							{
								connected=true;
								break;
							}
						}
					}
					m_clusterConnectivity[c0+c1*m_clusters.size()]=connected;
				}
			}
		}
	}

	return(m_clusters.size());
}